

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

SSL_SESSION * SSL_SESSION_copy_without_early_data(SSL_SESSION *session)

{
  int iVar1;
  __uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true> in_RAX;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var2;
  UniquePtr<SSL_SESSION> copy;
  
  copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       in_RAX.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  iVar1 = SSL_SESSION_early_data_capable(session);
  if (iVar1 == 0) {
    bssl::UpRef((bssl *)&copy,session);
    _Var2._M_head_impl = (ssl_session_st *)copy;
    copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
  }
  else {
    bssl::SSL_SESSION_dup((bssl *)&copy,session,3);
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      _Var2._M_head_impl = (ssl_session_st *)0x0;
    }
    else {
      *(undefined4 *)
       ((long)copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x184) = 0;
      *(byte *)((long)copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
           *(byte *)((long)copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) &
           0xfb | session->field_0x1b8 & 4;
      iVar1 = SSL_SESSION_early_data_capable
                        ((SSL_SESSION *)
                         copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      _Var2._M_head_impl = (ssl_session_st *)copy;
      if (iVar1 != 0) {
        __assert_fail("!SSL_SESSION_early_data_capable(copy.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                      ,0x402,"SSL_SESSION *SSL_SESSION_copy_without_early_data(SSL_SESSION *)");
      }
      copy._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    }
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&copy);
  return (SSL_SESSION *)(tuple<ssl_session_st_*,_bssl::internal::Deleter>)_Var2._M_head_impl;
}

Assistant:

SSL_SESSION *SSL_SESSION_copy_without_early_data(SSL_SESSION *session) {
  if (!SSL_SESSION_early_data_capable(session)) {
    return UpRef(session).release();
  }

  bssl::UniquePtr<SSL_SESSION> copy =
      SSL_SESSION_dup(session, SSL_SESSION_DUP_ALL);
  if (!copy) {
    return nullptr;
  }

  copy->ticket_max_early_data = 0;
  // Copied sessions are non-resumable until they're completely filled in.
  copy->not_resumable = session->not_resumable;
  assert(!SSL_SESSION_early_data_capable(copy.get()));
  return copy.release();
}